

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int testC(lua_State *L)

{
  int iVar1;
  undefined8 local_20;
  char *pc;
  lua_State *L1;
  lua_State *L_local;
  
  iVar1 = lua_isuserdata(L,1);
  if (iVar1 == 0) {
    iVar1 = lua_type(L,1);
    if (iVar1 == 8) {
      pc = (char *)lua_tothread(L,1);
      local_20 = luaL_checklstring(L,2,(size_t *)0x0);
    }
    else {
      local_20 = luaL_checklstring(L,1,(size_t *)0x0);
      pc = (char *)L;
    }
  }
  else {
    pc = (char *)getstate(L);
    local_20 = luaL_checklstring(L,2,(size_t *)0x0);
  }
  iVar1 = runC(L,(lua_State *)pc,local_20);
  return iVar1;
}

Assistant:

static int testC (lua_State *L) {
  lua_State *L1;
  const char *pc;
  if (lua_isuserdata(L, 1)) {
    L1 = getstate(L);
    pc = luaL_checkstring(L, 2);
  }
  else if (lua_isthread(L, 1)) {
    L1 = lua_tothread(L, 1);
    pc = luaL_checkstring(L, 2);
  }
  else {
    L1 = L;
    pc = luaL_checkstring(L, 1);
  }
  return runC(L, L1, pc);
}